

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<HashVerifier<AutoFile>,std::vector<CTxUndo,std::allocator<CTxUndo>>>
          (VectorFormatter<DefaultFormatter> *this,HashVerifier<AutoFile> *s,
          vector<CTxUndo,_std::allocator<CTxUndo>_> *v)

{
  pointer *ppCVar1;
  vector<Coin,_std::allocator<Coin>_> *pvVar2;
  vector<Coin,_std::allocator<Coin>_> *pvVar3;
  iterator __position;
  uint64_t uVar4;
  uint64_t __n;
  vector<Coin,_std::allocator<Coin>_> *this_00;
  ulong uVar5;
  long in_FS_OFFSET;
  VectorFormatter<TxInUndoFormatter> local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = &((v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
             super__Vector_impl_data._M_start)->vprevout;
  pvVar3 = &((v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
             super__Vector_impl_data._M_finish)->vprevout;
  this_00 = pvVar2;
  if (pvVar3 != pvVar2) {
    do {
      std::vector<Coin,_std::allocator<Coin>_>::~vector(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar3);
    (v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)pvVar2;
  }
  uVar4 = ReadCompactSize<HashVerifier<AutoFile>>(s,true);
  if (uVar4 != 0) {
    __n = 0;
    do {
      uVar5 = __n + 0x32dcd;
      __n = uVar4;
      if (uVar5 < uVar4) {
        __n = uVar5;
      }
      std::vector<CTxUndo,_std::allocator<CTxUndo>_>::reserve(v,__n);
      while (__position._M_current =
                  (v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
                  super__Vector_impl_data._M_finish,
            (ulong)(((long)__position._M_current -
                     (long)(v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < __n) {
        if (__position._M_current ==
            (v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::_M_realloc_insert<>(v,__position);
        }
        else {
          ((__position._M_current)->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppCVar1 = &(v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        VectorFormatter<TxInUndoFormatter>::
        Unser<HashVerifier<AutoFile>,std::vector<Coin,std::allocator<Coin>>>
                  (&local_39,s,
                   &(v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1].vprevout);
      }
    } while (uVar5 < uVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }